

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChTriangleMeshConnected::ComputeMassProperties
          (ChTriangleMeshConnected *this,bool bodyCoords,double *mass,ChVector<double> *center,
          ChMatrix33<double> *inertia)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  pointer pCVar12;
  pointer pCVar13;
  double dVar14;
  undefined1 auVar15 [16];
  int iVar16;
  int i;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_48;
  double local_40;
  
  local_78 = 0.0;
  lVar18 = 8;
  lVar17 = 0;
  local_70 = local_78;
  local_68 = local_78;
  local_60 = local_78;
  local_48 = local_78;
  local_40 = local_78;
  while( true ) {
    iVar16 = (*(this->super_ChTriangleMesh).super_ChGeometry._vptr_ChGeometry[0xd])(this);
    if (iVar16 <= lVar17) break;
    pCVar12 = (this->m_face_v_indices).
              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pCVar13 = (this->m_vertices).
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar17 = lVar17 + 1;
    iVar16 = *(int *)((long)pCVar12->m_data + lVar18 + -8);
    iVar10 = *(int *)((long)pCVar12->m_data + lVar18 + -4);
    iVar11 = *(int *)((long)pCVar12->m_data + lVar18);
    lVar18 = lVar18 + 0xc;
    dVar1 = pCVar13[iVar16].m_data[0];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar1;
    dVar2 = pCVar13[iVar16].m_data[1];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = dVar2;
    dVar3 = pCVar13[iVar16].m_data[2];
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar3;
    dVar4 = pCVar13[iVar11].m_data[1];
    auVar59._8_8_ = 0;
    auVar59._0_8_ = dVar4;
    dVar5 = pCVar13[iVar11].m_data[2];
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar5;
    dVar6 = pCVar13[iVar11].m_data[0];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar6;
    dVar7 = pCVar13[iVar10].m_data[2];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar7;
    dVar8 = pCVar13[iVar10].m_data[0];
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar8;
    dVar9 = pCVar13[iVar10].m_data[1];
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar9;
    auVar19 = vmulsd_avx512f(auVar26,auVar26);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = dVar9 - dVar2;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = dVar5 - dVar3;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = (dVar4 - dVar2) * (dVar7 - dVar3);
    auVar25 = vfmsub231sd_fma(auVar66,auVar48,auVar64);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = (dVar5 - dVar3) * (dVar8 - dVar1);
    auVar75._8_8_ = 0;
    auVar75._0_8_ = dVar7 - dVar3;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = dVar6 - dVar1;
    auVar15 = vfmsub231sd_fma(auVar65,auVar79,auVar75);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = (dVar6 - dVar1) * (dVar9 - dVar2);
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar8 - dVar1;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = dVar4 - dVar2;
    auVar27 = vfmsub231sd_fma(auVar49,auVar71,auVar83);
    dVar14 = dVar1 + dVar8 + dVar6;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = dVar1 + dVar8;
    auVar20 = vfmadd213sd_avx512f(auVar80,auVar36,auVar19);
    auVar76._8_8_ = 0;
    auVar76._0_8_ = dVar14;
    auVar21 = vfmadd213sd_avx512f(auVar76,auVar28,auVar20);
    auVar84._8_8_ = 0;
    auVar84._0_8_ = auVar20._0_8_ * dVar8;
    auVar19 = vfmadd231sd_avx512f(auVar84,auVar26,auVar19);
    auVar81._8_8_ = 0;
    auVar81._0_8_ = dVar14 + dVar8;
    auVar20 = vfmadd213sd_avx512f(auVar81,auVar36,auVar21);
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar14 + dVar1;
    auVar22 = vfmadd213sd_avx512f(auVar72,auVar26,auVar21);
    auVar23 = vfmadd231sd_avx512f(auVar19,auVar28,auVar21);
    auVar24 = vfmadd231sd_avx512f(ZEXT816(0),auVar25,auVar76);
    auVar82._8_8_ = 0;
    auVar82._0_8_ = dVar9 * auVar20._0_8_;
    auVar19 = vfmadd231sd_fma(auVar82,auVar51,auVar22);
    auVar77._8_8_ = 0;
    auVar77._0_8_ = dVar14 + dVar6;
    auVar20 = vfmadd213sd_avx512f(auVar77,auVar28,auVar21);
    vmovsd_avx512f(auVar24);
    auVar19 = vfmadd231sd_fma(auVar19,auVar59,auVar20);
    dVar1 = dVar9 + dVar2 + dVar4;
    auVar20 = vfmadd231sd_avx512f(ZEXT816(0),auVar25,auVar21);
    vmovsd_avx512f(auVar20);
    auVar20 = vfmadd231sd_avx512f(ZEXT816(0),auVar25,auVar23);
    vmovsd_avx512f(auVar20);
    auVar25 = vfmadd231sd_avx512f(ZEXT816(0),auVar25,auVar19);
    auVar78._8_8_ = 0;
    auVar78._0_8_ = dVar1;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = dVar2 * dVar2;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dVar9 + dVar2;
    auVar19 = vfmadd213sd_fma(auVar73,auVar56,auVar67);
    vmovsd_avx512f(auVar25);
    auVar25 = vfmadd213sd_fma(auVar78,auVar59,auVar19);
    auVar74._8_8_ = 0;
    auVar74._0_8_ = dVar9 * auVar19._0_8_;
    auVar20 = vfmadd231sd_fma(auVar74,auVar51,auVar67);
    auVar68._8_8_ = 0;
    auVar68._0_8_ = dVar1 + dVar2;
    auVar19 = vfmadd213sd_fma(auVar68,auVar51,auVar25);
    auVar22 = vfmadd231sd_fma(auVar20,auVar59,auVar25);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar9 + dVar1;
    auVar20 = vfmadd213sd_fma(auVar52,auVar56,auVar25);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = dVar4 + dVar1;
    auVar21 = vfmadd213sd_fma(auVar57,auVar59,auVar25);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_60;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar7 * auVar20._0_8_;
    auVar19 = vfmadd231sd_fma(auVar53,auVar31,auVar19);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = local_48;
    auVar25 = vfmadd231sd_fma(auVar60,auVar15,auVar25);
    auVar19 = vfmadd231sd_fma(auVar19,auVar41,auVar21);
    local_60 = auVar25._0_8_;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_78;
    auVar19 = vfmadd231sd_fma(auVar69,auVar15,auVar19);
    local_48 = auVar19._0_8_;
    auVar19 = vfmadd231sd_fma(auVar61,auVar15,auVar22);
    local_78 = auVar19._0_8_;
    dVar1 = dVar3 + dVar7 + dVar5;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar3 * dVar3;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = dVar3 + dVar7;
    auVar19 = vfmadd213sd_fma(auVar62,auVar43,auVar54);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = dVar1;
    auVar25 = vfmadd213sd_fma(auVar58,auVar41,auVar19);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = auVar19._0_8_ * dVar7;
    auVar21 = vfmadd231sd_fma(auVar63,auVar31,auVar54);
    auVar70._8_8_ = 0;
    auVar70._0_8_ = dVar1 + dVar3;
    auVar19 = vfmadd213sd_fma(auVar70,auVar31,auVar25);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar1 + dVar7;
    auVar20 = vfmadd213sd_fma(auVar32,auVar43,auVar25);
    auVar21 = vfmadd231sd_fma(auVar21,auVar41,auVar25);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = dVar8 * auVar20._0_8_;
    auVar20 = vfmadd231sd_fma(auVar33,auVar26,auVar19);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar1 + dVar5;
    auVar19 = vfmadd213sd_fma(auVar37,auVar41,auVar25);
    auVar19 = vfmadd231sd_fma(auVar20,auVar28,auVar19);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_68;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_70;
    auVar25 = vfmadd231sd_fma(auVar29,auVar27,auVar25);
    auVar20 = vfmadd231sd_fma(auVar38,auVar27,auVar21);
    local_68 = auVar25._0_8_;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_40;
    local_70 = auVar20._0_8_;
    auVar19 = vfmadd231sd_fma(auVar30,auVar27,auVar19);
    local_40 = auVar19._0_8_;
  }
  *mass = 0.0;
  dVar1 = local_70 * 0.016666666666666666 + local_78 * 0.016666666666666666;
  center->m_data[0] = NAN;
  center->m_data[1] = local_60 * 0.041666666666666664 * INFINITY;
  local_40 = local_40 * -0.008333333333333333;
  local_48 = local_48 * -0.008333333333333333;
  center->m_data[2] = local_68 * 0.041666666666666664 * INFINITY;
  dVar2 = local_70 * 0.016666666666666666 + 0.0;
  dVar3 = local_78 * 0.016666666666666666 + 0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = dVar1;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = -0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = local_40;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = -0.0;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = dVar2;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = local_48;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = local_40;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = local_48;
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = dVar3;
  if (bodyCoords) {
    auVar50._8_8_ = 0;
    auVar50._0_8_ = center->m_data[1];
    auVar55._8_8_ = 0;
    auVar55._0_8_ = center->m_data[2] * center->m_data[2];
    auVar25 = vfmadd231sd_fma(auVar55,auVar50,auVar50);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *mass;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = dVar1;
    auVar19 = vfnmadd132sd_fma(auVar25,auVar44,auVar19);
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         auVar19._0_8_;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = center->m_data[1];
    auVar45._8_8_ = 0;
    auVar45._0_8_ = *mass * center->m_data[0];
    auVar19 = vfmadd231sd_fma(ZEXT816(0x8000000000000000),auVar45,auVar25);
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         auVar19._0_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = center->m_data[0];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_40;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = *mass * center->m_data[2];
    auVar25 = vfmadd231sd_fma(auVar27,auVar46,auVar20);
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         auVar25._0_8_;
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         auVar19._0_8_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = center->m_data[2];
    auVar42._8_8_ = 0;
    auVar42._0_8_ = center->m_data[0] * center->m_data[0];
    auVar19 = vfmadd231sd_fma(auVar42,auVar47,auVar47);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = *mass;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar2;
    auVar19 = vfnmadd132sd_fma(auVar19,auVar39,auVar21);
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         auVar19._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = center->m_data[2];
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_48;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = *mass * center->m_data[1];
    auVar19 = vfmadd231sd_fma(auVar34,auVar40,auVar22);
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         auVar19._0_8_;
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         auVar25._0_8_;
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         auVar19._0_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = center->m_data[0];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = center->m_data[1] * center->m_data[1];
    auVar19 = vfmadd231sd_fma(auVar35,auVar23,auVar23);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *mass;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar3;
    auVar19 = vfnmadd132sd_fma(auVar19,auVar24,auVar15);
    (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         auVar19._0_8_;
  }
  return;
}

Assistant:

void ChTriangleMeshConnected::ComputeMassProperties(bool bodyCoords,
                                                    double& mass,
                                                    ChVector<>& center,
                                                    ChMatrix33<>& inertia) {
    const double oneDiv6 = (double)(1.0 / 6.0);
    const double oneDiv24 = (double)(1.0 / 24.0);
    const double oneDiv60 = (double)(1.0 / 60.0);
    const double oneDiv120 = (double)(1.0 / 120.0);

    // order:  1, x, y, z, x^2, y^2, z^2, xy, yz, zx
    double integral[10] = {(double)0.0, (double)0.0, (double)0.0, (double)0.0, (double)0.0,
                           (double)0.0, (double)0.0, (double)0.0, (double)0.0, (double)0.0};

    for (int i = 0; i < this->getNumTriangles(); i++) {
        // Get vertices of triangle i.
        ChVector<double> v0 = this->m_vertices[m_face_v_indices[i].x()];
        ChVector<double> v1 = this->m_vertices[m_face_v_indices[i].y()];
        ChVector<double> v2 = this->m_vertices[m_face_v_indices[i].z()];

        // Get cross product of edges and normal vector.
        ChVector<double> V1mV0 = v1 - v0;
        ChVector<double> V2mV0 = v2 - v0;
        ChVector<double> N = Vcross(V1mV0, V2mV0);

        // Compute integral terms.
        double tmp0, tmp1, tmp2;
        double f1x, f2x, f3x, g0x, g1x, g2x;
        tmp0 = v0.x() + v1.x();
        f1x = tmp0 + v2.x();
        tmp1 = v0.x() * v0.x();
        tmp2 = tmp1 + v1.x() * tmp0;
        f2x = tmp2 + v2.x() * f1x;
        f3x = v0.x() * tmp1 + v1.x() * tmp2 + v2.x() * f2x;
        g0x = f2x + v0.x() * (f1x + v0.x());
        g1x = f2x + v1.x() * (f1x + v1.x());
        g2x = f2x + v2.x() * (f1x + v2.x());

        double f1y, f2y, f3y, g0y, g1y, g2y;
        tmp0 = v0.y() + v1.y();
        f1y = tmp0 + v2.y();
        tmp1 = v0.y() * v0.y();
        tmp2 = tmp1 + v1.y() * tmp0;
        f2y = tmp2 + v2.y() * f1y;
        f3y = v0.y() * tmp1 + v1.y() * tmp2 + v2.y() * f2y;
        g0y = f2y + v0.y() * (f1y + v0.y());
        g1y = f2y + v1.y() * (f1y + v1.y());
        g2y = f2y + v2.y() * (f1y + v2.y());

        double f1z, f2z, f3z, g0z, g1z, g2z;
        tmp0 = v0.z() + v1.z();
        f1z = tmp0 + v2.z();
        tmp1 = v0.z() * v0.z();
        tmp2 = tmp1 + v1.z() * tmp0;
        f2z = tmp2 + v2.z() * f1z;
        f3z = v0.z() * tmp1 + v1.z() * tmp2 + v2.z() * f2z;
        g0z = f2z + v0.z() * (f1z + v0.z());
        g1z = f2z + v1.z() * (f1z + v1.z());
        g2z = f2z + v2.z() * (f1z + v2.z());

        // Update integrals.
        integral[0] += N.x() * f1x;
        integral[1] += N.x() * f2x;
        integral[2] += N.y() * f2y;
        integral[3] += N.z() * f2z;
        integral[4] += N.x() * f3x;
        integral[5] += N.y() * f3y;
        integral[6] += N.z() * f3z;
        integral[7] += N.x() * (v0.y() * g0x + v1.y() * g1x + v2.y() * g2x);
        integral[8] += N.y() * (v0.z() * g0y + v1.z() * g1y + v2.z() * g2y);
        integral[9] += N.z() * (v0.x() * g0z + v1.x() * g1z + v2.x() * g2z);
    }

    integral[0] *= oneDiv6;
    integral[1] *= oneDiv24;
    integral[2] *= oneDiv24;
    integral[3] *= oneDiv24;
    integral[4] *= oneDiv60;
    integral[5] *= oneDiv60;
    integral[6] *= oneDiv60;
    integral[7] *= oneDiv120;
    integral[8] *= oneDiv120;
    integral[9] *= oneDiv120;

    // mass
    mass = integral[0];

    // center of mass
    center = ChVector<double>(integral[1], integral[2], integral[3]) / mass;

    // inertia relative to world origin
    inertia(0, 0) = integral[5] + integral[6];
    inertia(0, 1) = -integral[7];
    inertia(0, 2) = -integral[9];
    inertia(1, 0) = inertia(0, 1);
    inertia(1, 1) = integral[4] + integral[6];
    inertia(1, 2) = -integral[8];
    inertia(2, 0) = inertia(0, 2);
    inertia(2, 1) = inertia(1, 2);
    inertia(2, 2) = integral[4] + integral[5];

    // inertia relative to center of mass
    if (bodyCoords) {
        inertia(0, 0) -= mass * (center.y() * center.y() + center.z() * center.z());
        inertia(0, 1) += mass * center.x() * center.y();
        inertia(0, 2) += mass * center.z() * center.x();
        inertia(1, 0) = inertia(0, 1);
        inertia(1, 1) -= mass * (center.z() * center.z() + center.x() * center.x());
        inertia(1, 2) += mass * center.y() * center.z();
        inertia(2, 0) = inertia(0, 2);
        inertia(2, 1) = inertia(1, 2);
        inertia(2, 2) -= mass * (center.x() * center.x() + center.y() * center.y());
    }
}